

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeQueue.hpp
# Opt level: O3

void __thiscall
crsGA::ThreadSafeQueue<std::function<void_()>_>::push
          (ThreadSafeQueue<std::function<void_()>_> *this,function<void_()> *new_value)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mtx);
  if (iVar1 == 0) {
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)this,new_value)
    ;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void push(T&& new_value)
        {
            std::lock_guard<std::mutex> lock(_mtx);
            _data.push(std::move(new_value));
            _data_cond.notify_one();
        }